

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O3

RealType __thiscall OpenMD::LJ::getSigma(LJ *this,AtomType *atomType1,AtomType *atomType2)

{
  pointer pcVar1;
  int iVar2;
  RealType RVar3;
  RealType RVar4;
  double __x;
  string DistanceMix;
  LennardJonesAdapter lja2;
  LennardJonesAdapter lja1;
  locale local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  LennardJonesAdapter local_28;
  LennardJonesAdapter local_20;
  
  local_28.at_ = atomType2;
  local_20.at_ = atomType1;
  RVar3 = LennardJonesAdapter::getSigma(&local_20);
  RVar4 = LennardJonesAdapter::getSigma(&local_28);
  pcVar1 = (this->forceField_->forceFieldOptions_).DistanceMixingRule.data_._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,
             pcVar1 + (this->forceField_->forceFieldOptions_).DistanceMixingRule.data_.
                      _M_string_length);
  std::locale::locale(local_50);
  toUpper<std::__cxx11::string>(&local_48,local_50);
  std::locale::~locale(local_50);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar2 == 0) {
    __x = RVar3 * RVar4;
    if (__x < 0.0) {
      RVar3 = sqrt(__x);
    }
    else {
      RVar3 = SQRT(__x);
    }
  }
  else {
    RVar3 = (RVar3 + RVar4) * 0.5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return RVar3;
}

Assistant:

RealType LJ::getSigma(AtomType* atomType1, AtomType* atomType2) {
    LennardJonesAdapter lja1 = LennardJonesAdapter(atomType1);
    LennardJonesAdapter lja2 = LennardJonesAdapter(atomType2);
    RealType sigma1          = lja1.getSigma();
    RealType sigma2          = lja2.getSigma();

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    string DistanceMix       = fopts.getDistanceMixingRule();
    toUpper(DistanceMix);

    if (DistanceMix == "GEOMETRIC")
      return sqrt(sigma1 * sigma2);
    else
      return 0.5 * (sigma1 + sigma2);
  }